

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt __thiscall slang::SVInt::operator%(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  logic_t lVar4;
  SVInt *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  bool isSigned;
  bool bVar6;
  SVInt SVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aStack_68;
  uint uStack_60;
  undefined1 uStack_5c;
  byte bStack_5b;
  byte local_51;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_50;
  uint local_48;
  byte local_43;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  undefined8 uVar5;
  
  isSigned = (bool)((in_RDX->super_SVIntStorage).signFlag & (rhs->super_SVIntStorage).signFlag);
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  uVar3 = (in_RDX->super_SVIntStorage).bitWidth;
  if (uVar2 == uVar3) {
    bVar1 = (rhs->super_SVIntStorage).unknownFlag;
    local_51 = (in_RDX->super_SVIntStorage).unknownFlag;
    bStack_5b = 0;
    aStack_68.val._0_6_ = 0;
    aStack_68.val._6_2_ = 0;
    uStack_5c = 1;
    uStack_60 = 1;
    clearUnusedBits((SVInt *)&aStack_68);
    lVar4 = operator==(in_RDX,(SVInt *)&aStack_68);
    bVar6 = true;
    if ((bVar1 == false) && ((local_51 & 1) == 0)) {
      bVar6 = (lVar4.value & 0x7f) != 0 && lVar4.value != '@';
    }
    if (((0x40 < uStack_60) || ((bStack_5b & 1) != 0)) &&
       ((void *)CONCAT26(aStack_68.val._6_2_,aStack_68.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(aStack_68.val._6_2_,aStack_68.val._0_6_));
    }
    if (bVar6) {
      SVar7 = createFillX(this,(rhs->super_SVIntStorage).bitWidth,isSigned);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
      goto LAB_0018ab30;
    }
    if (isSigned != false) {
      lVar4 = operator[](rhs,(rhs->super_SVIntStorage).bitWidth - 1);
      if (((lVar4.value != '\0') && (lVar4.value != '@')) && (lVar4.value != 0x80)) {
        lVar4 = operator[](in_RDX,(in_RDX->super_SVIntStorage).bitWidth - 1);
        if (((lVar4.value == '\0') || (lVar4.value == '@')) || (lVar4.value == 0x80)) {
          operator-((SVInt *)&local_50);
          urem((SVInt *)&aStack_68,(SVInt *)&local_50,in_RDX,true);
          SVar7 = operator-(this);
          uVar5 = SVar7.super_SVIntStorage._8_8_;
          if ((0x40 < uStack_60) || ((bStack_5b & 1) != 0)) {
            local_40.val._6_2_ = aStack_68.val._6_2_;
            local_40.val._0_6_ = aStack_68.val._0_6_;
            goto LAB_0018ac3d;
          }
        }
        else {
          operator-((SVInt *)&local_50);
          operator-((SVInt *)&local_40);
          urem((SVInt *)&aStack_68,(SVInt *)&local_50,(SVInt *)&local_40,true);
          SVar7 = operator-(this);
          uVar5 = SVar7.super_SVIntStorage._8_8_;
          if (((0x40 < uStack_60) || ((bStack_5b & 1) != 0)) &&
             ((void *)CONCAT26(aStack_68.val._6_2_,aStack_68.val._0_6_) != (void *)0x0)) {
            operator_delete__((void *)CONCAT26(aStack_68.val._6_2_,aStack_68.val._0_6_));
            uVar5 = extraout_RDX_00;
          }
          if ((0x40 < local_38) || ((local_33 & 1) != 0)) {
LAB_0018ac3d:
            if ((void *)local_40.val != (void *)0x0) {
              operator_delete__(local_40.pVal);
              uVar5 = extraout_RDX_01;
            }
          }
        }
        if ((local_48 < 0x41) && ((local_43 & 1) == 0)) goto LAB_0018ab30;
        goto LAB_0018ab26;
      }
      lVar4 = operator[](in_RDX,(in_RDX->super_SVIntStorage).bitWidth - 1);
      if ((lVar4.value != '\0') && ((lVar4.value != '@' && (lVar4.value != 0x80)))) {
        operator-((SVInt *)&aStack_68);
        SVar7 = urem(this,rhs,(SVInt *)&aStack_68,true);
        uVar5 = SVar7.super_SVIntStorage._8_8_;
        goto LAB_0018ab14;
      }
    }
    SVar7 = urem(this,rhs,in_RDX,false);
    uVar5 = SVar7.super_SVIntStorage._8_8_;
  }
  else {
    if (uVar2 < uVar3) {
      if (isSigned == false) {
        zext((SVInt *)&aStack_68,(bitwidth_t)rhs);
      }
      else {
        sext((SVInt *)&aStack_68,(bitwidth_t)rhs);
      }
      SVar7 = operator%(this,(SVInt *)&aStack_68);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
    }
    else {
      if (isSigned == false) {
        zext((SVInt *)&aStack_68,(bitwidth_t)in_RDX);
      }
      else {
        sext((SVInt *)&aStack_68,(bitwidth_t)in_RDX);
      }
      SVar7 = operator%(this,rhs);
      uVar5 = SVar7.super_SVIntStorage._8_8_;
    }
LAB_0018ab14:
    if ((uStack_60 < 0x41) && ((bStack_5b & 1) == 0)) goto LAB_0018ab30;
    local_50.val._6_2_ = aStack_68.val._6_2_;
    local_50.val._0_6_ = aStack_68.val._0_6_;
LAB_0018ab26:
    if ((void *)local_50.val != (void *)0x0) {
      operator_delete__(local_50.pVal);
      uVar5 = extraout_RDX;
    }
  }
LAB_0018ab30:
  SVar7.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar7.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator%(const SVInt& rhs) const {
    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) % rhs;
        else
            return *this % rhs.extend(bitWidth, bothSigned);
    }

    // Any X's mean all X's; also dividing by zero does the same
    if (unknownFlag || rhs.unknownFlag || rhs == 0)
        return createFillX(bitWidth, bothSigned);

    // handle signed remainder
    if (bothSigned) {
        // do the remainder on positive numbers and flip the sign at the end
        if (isNegative()) {
            if (rhs.isNegative())
                return -urem(-(*this), -rhs, true);
            return -urem(-(*this), rhs, true);
        }
        if (rhs.isNegative())
            return urem(*this, -rhs, true);
    }

    // otherwise, just do the remainder
    return urem(*this, rhs, false);
}